

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int on_ack_max_streams(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,
                      quicly_sent_t *sent)

{
  ulong uVar1;
  byte *pbVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = (ulong)((sent->data).max_streams.uni == 0) << 5 | 0xffffffffffffff48;
  if (acked == 0) {
    lVar4 = *(long *)((long)&map->num_packets + uVar1);
    if (lVar4 == 0) {
      __assert_fail("m->num_inflight != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                    ,0x80,
                    "void quicly_maxsender_lost(quicly_maxsender_t *, quicly_maxsender_sent_t *)");
    }
  }
  else {
    uVar3 = (sent->data).ack.range.end >> 1;
    if (*(long *)((long)&map->tail + uVar1) < (long)uVar3) {
      *(ulong *)((long)&map->tail + uVar1) = uVar3;
    }
    if ((undefined1  [24])((undefined1  [24])sent->data & (undefined1  [24])0x1) ==
        (undefined1  [24])0x0) {
      return 0;
    }
    lVar4 = *(long *)((long)&map->num_packets + uVar1);
    if (lVar4 == 0) {
      __assert_fail("m->num_inflight != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                    ,0x77,
                    "void quicly_maxsender_acked(quicly_maxsender_t *, quicly_maxsender_sent_t *)");
    }
  }
  pbVar2 = (byte *)((long)&sent->data + 8);
  *(long *)((long)&map->num_packets + uVar1) = lVar4 + -1;
  *pbVar2 = *pbVar2 & 0xfe;
  return 0;
}

Assistant:

static int on_ack_max_streams(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_maxsender_t *maxsender = sent->data.max_streams.uni ? &conn->ingress.max_streams.uni : &conn->ingress.max_streams.bidi;
    assert(maxsender != NULL); /* we would only receive an ACK if we have sent the frame */

    if (acked) {
        quicly_maxsender_acked(maxsender, &sent->data.max_streams.args);
    } else {
        quicly_maxsender_lost(maxsender, &sent->data.max_streams.args);
    }

    return 0;
}